

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_vector_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b24676::MotionVectorTestLarge::PreEncodeFrameHook
          (MotionVectorTestLarge *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  
  iVar1 = (*video->_vptr_VideoSource[8])(video);
  if (iVar1 == 0) {
    libaom_test::Encoder::Control(encoder,0xd,this->cpu_used_);
    libaom_test::Encoder::Control(encoder,0x6e,this->mv_test_mode_);
    if (*(int *)&(this->super_EncoderTest).field_0x3dc != 0) {
      libaom_test::Encoder::Control(encoder,0xe,1);
      libaom_test::Encoder::Control(encoder,0x15,7);
      libaom_test::Encoder::Control(encoder,0x16,5);
      return;
    }
  }
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
      encoder->Control(AV1E_ENABLE_MOTION_VECTOR_UNIT_TEST, mv_test_mode_);
      if (encoding_mode_ != ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      }
    }
  }